

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  undefined8 uVar1;
  pointer pSVar2;
  pointer pPVar3;
  pointer pTVar4;
  size_t sVar5;
  ulong uVar6;
  string local_178;
  undefined1 auStack_158 [8];
  RayTracer tracer;
  RayTracerConfig config;
  
  tracer.threadNumber = 2;
  tracer._172_4_ = 1;
  config.super_BaseConfig.antiAliasing = 0x3dcccccd;
  config.super_BaseConfig.light.y._0_2_ = 0;
  config.super_BaseConfig.light.y._2_1_ = 0;
  config.super_BaseConfig.background.r = '\0';
  config.super_BaseConfig.background.g = '\0';
  config.super_BaseConfig.background.b = '\0';
  config.super_BaseConfig._51_1_ = 0;
  config._52_4_ = 0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Using default config",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    RayTracerConfig::defaultConfig();
    pSVar2 = config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar1 = config._48_8_;
    config.super_BaseConfig.light.y._0_2_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.y._0_2_;
    config.super_BaseConfig.light.y._2_1_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.y._2_1_;
    config.super_BaseConfig.observer.x =
         tracer.super_RayTracerBase.config.super_BaseConfig.observer.x;
    config.super_BaseConfig.observer.y =
         tracer.super_RayTracerBase.config.super_BaseConfig.observer.y;
    config.super_BaseConfig.light.x._3_1_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.x._3_1_;
    config.super_BaseConfig.ambientCoefficient =
         tracer.super_RayTracerBase.config.super_BaseConfig.ambientCoefficient;
    config.super_BaseConfig.imageX = tracer.super_RayTracerBase.config.super_BaseConfig.imageX;
    config.super_BaseConfig.imageY = tracer.super_RayTracerBase.config.super_BaseConfig.imageY;
    config.super_BaseConfig.imageZ = tracer.super_RayTracerBase.config.super_BaseConfig.imageZ;
    tracer._168_8_ = auStack_158;
    config.super_BaseConfig.antiAliasing =
         tracer.super_RayTracerBase.config.super_BaseConfig.antiAliasing;
    config.super_BaseConfig.maxRecursionLevel =
         tracer.super_RayTracerBase.config.super_BaseConfig.maxRecursionLevel;
    config.super_BaseConfig.background =
         tracer.super_RayTracerBase.config.super_BaseConfig.background;
    config.super_BaseConfig._51_1_ = tracer.super_RayTracerBase.config.super_BaseConfig._51_1_;
    config._52_4_ = tracer.super_RayTracerBase.config._52_4_;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_start =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_start;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_finish =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar1 != 0) {
      operator_delete((void *)uVar1,(long)pSVar2 - uVar1);
    }
    pPVar3 = config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar2 = config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_start = tracer.super_RayTracerBase.config.planes.
               super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
               _M_start;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_finish = tracer.super_RayTracerBase.config.planes.
                super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2,(long)pPVar3 - (long)pSVar2);
    }
    pTVar4 = config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar3 = config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_start =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_start;
    config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (pPVar3 != (pointer)0x0) {
      operator_delete(pPVar3,(long)pTVar4 - (long)pPVar3);
      if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(tracer.super_RayTracerBase.config.planes.
                        super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)tracer.super_RayTracerBase.config.triangles.
                              super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)tracer.super_RayTracerBase.config.planes.
                              super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      }
    }
    if (tracer.super_RayTracerBase.config.spheres.
        super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.spheres.
                      super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config._48_8_ == 0) goto LAB_00104a3c;
    uVar6 = (long)tracer.super_RayTracerBase.config.spheres.
                  super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_finish - tracer.super_RayTracerBase.config._48_8_;
    local_178._M_dataplus._M_p = (pointer)tracer.super_RayTracerBase.config._48_8_;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading config from file ",0x19);
    __s = argv[1];
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f1b8);
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::__cxx11::string::string
              ((string *)&local_178,argv[1],
               (allocator *)
               ((long)&config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    RayTracerConfig::fromFile((RayTracerConfig *)auStack_158,&local_178);
    pSVar2 = config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar1 = config._48_8_;
    config.super_BaseConfig.light.y._0_2_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.y._0_2_;
    config.super_BaseConfig.light.y._2_1_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.y._2_1_;
    config.super_BaseConfig.observer.x =
         tracer.super_RayTracerBase.config.super_BaseConfig.observer.x;
    config.super_BaseConfig.observer.y =
         tracer.super_RayTracerBase.config.super_BaseConfig.observer.y;
    config.super_BaseConfig.light.x._3_1_ =
         tracer.super_RayTracerBase.config.super_BaseConfig.light.x._3_1_;
    config.super_BaseConfig.ambientCoefficient =
         tracer.super_RayTracerBase.config.super_BaseConfig.ambientCoefficient;
    config.super_BaseConfig.imageX = tracer.super_RayTracerBase.config.super_BaseConfig.imageX;
    config.super_BaseConfig.imageY = tracer.super_RayTracerBase.config.super_BaseConfig.imageY;
    config.super_BaseConfig.imageZ = tracer.super_RayTracerBase.config.super_BaseConfig.imageZ;
    tracer._168_8_ = auStack_158;
    config.super_BaseConfig.antiAliasing =
         tracer.super_RayTracerBase.config.super_BaseConfig.antiAliasing;
    config.super_BaseConfig.maxRecursionLevel =
         tracer.super_RayTracerBase.config.super_BaseConfig.maxRecursionLevel;
    config.super_BaseConfig.background =
         tracer.super_RayTracerBase.config.super_BaseConfig.background;
    config.super_BaseConfig._51_1_ = tracer.super_RayTracerBase.config.super_BaseConfig._51_1_;
    config._52_4_ = tracer.super_RayTracerBase.config._52_4_;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_start =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_start;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_finish =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar1 != 0) {
      operator_delete((void *)uVar1,(long)pSVar2 - uVar1);
    }
    pPVar3 = config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar2 = config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         tracer.super_RayTracerBase.config.spheres.
         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_start = tracer.super_RayTracerBase.config.planes.
               super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
               _M_start;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_finish = tracer.super_RayTracerBase.config.planes.
                super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2,(long)pPVar3 - (long)pSVar2);
    }
    pTVar4 = config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar3 = config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_start =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_start;
    config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (pPVar3 != (pointer)0x0) {
      operator_delete(pPVar3,(long)pTVar4 - (long)pPVar3);
      if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(tracer.super_RayTracerBase.config.planes.
                        super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)tracer.super_RayTracerBase.config.triangles.
                              super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)tracer.super_RayTracerBase.config.planes.
                              super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      }
    }
    if (tracer.super_RayTracerBase.config.spheres.
        super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.spheres.
                      super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config._48_8_ != 0) {
      operator_delete((void *)tracer.super_RayTracerBase.config._48_8_,
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      tracer.super_RayTracerBase.config._48_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_00104a3c;
    uVar6 = local_178.field_2._M_allocated_capacity + 1;
  }
  operator_delete(local_178._M_dataplus._M_p,uVar6);
LAB_00104a3c:
  operator<<((ostream *)&std::cerr,(RayTracerConfig *)&tracer.threadNumber);
  RayTracer::RayTracer((RayTracer *)auStack_158,(RayTracerConfig *)&tracer.threadNumber);
  RayTracer::processPixels((RayTracer *)auStack_158);
  RayTracerBase::printBitmap((RayTracerBase *)auStack_158,(ostream *)&std::cout);
  if (tracer.super_RayTracerBase.bitmap.cols != 0) {
    operator_delete((void *)tracer.super_RayTracerBase.bitmap.cols,
                    (long)tracer.super_RayTracerBase.bitmap.data_.
                          super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                          super__Vector_impl_data._M_finish - tracer.super_RayTracerBase.bitmap.cols
                   );
  }
  if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(tracer.super_RayTracerBase.config.planes.
                    super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)tracer.super_RayTracerBase.config.triangles.
                          super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tracer.super_RayTracerBase.config.planes.
                          super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(tracer.super_RayTracerBase.config.spheres.
                    super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)tracer.super_RayTracerBase.config.planes.
                          super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tracer.super_RayTracerBase.config.spheres.
                          super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (tracer.super_RayTracerBase.config._48_8_ != 0) {
    operator_delete((void *)tracer.super_RayTracerBase.config._48_8_,
                    (long)tracer.super_RayTracerBase.config.spheres.
                          super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    tracer.super_RayTracerBase.config._48_8_);
  }
  if (config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  }
  if (config._48_8_ != 0) {
    operator_delete((void *)config._48_8_,
                    (long)config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl
                          .super__Vector_impl_data._M_finish - config._48_8_);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromFile(argv[1]);
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();
  }
  std::cerr << config;

  RayTracer tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}